

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask26_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar2 = in[1];
  *out = uVar2 << 0x1a | uVar1;
  uVar2 = uVar2 >> 6;
  out[1] = uVar2;
  uVar1 = in[2];
  out[1] = uVar1 << 0x14 | uVar2;
  uVar1 = uVar1 >> 0xc;
  out[2] = uVar1;
  uVar2 = in[3];
  out[2] = uVar2 << 0xe | uVar1;
  uVar2 = uVar2 >> 0x12;
  out[3] = uVar2;
  uVar1 = in[4];
  out[3] = uVar1 << 8 | uVar2;
  uVar1 = uVar1 >> 0x18;
  out[4] = uVar1;
  uVar1 = in[5] << 2 | uVar1;
  out[4] = uVar1;
  uVar2 = in[6];
  out[4] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[5] = uVar2;
  uVar1 = in[7];
  out[5] = uVar1 << 0x16 | uVar2;
  out[6] = uVar1 >> 10;
  return out + 7;
}

Assistant:

uint32_t *__fastpackwithoutmask26_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (26 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (26 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (26 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (26 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (26 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (26 - 16);
  ++in;

  return out + 1;
}